

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::uploadSparseImage
          (ShaderRenderCaseInstance *this,TextureFormat *texFormat,TextureData *textureData,
          Sampler *refSampler,deUint32 mipLevels,deUint32 arrayLayers,VkImage sparseImage,
          VkImageCreateInfo *imageCreateInfo,UVec3 *texSize)

{
  Allocator *pAVar1;
  deUint64 dVar2;
  VkCommandBuffer_s *pVVar3;
  RefData<vk::Handle<(vk::HandleType)4>_> data;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  bool bVar4;
  deUint32 dVar5;
  uint uVar6;
  VkResult VVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  VkDevice device;
  DeviceInterface *vk_00;
  VkPhysicalDevice physicalDevice_00;
  VkQueue pVVar12;
  NotSupportedError *pNVar13;
  pointer pvVar14;
  reference pvVar15;
  size_type sVar16;
  Allocation *pAVar17;
  Handle<(vk::HandleType)24> *pHVar18;
  Handle<(vk::HandleType)8> *pHVar19;
  VkDeviceMemory VVar20;
  VkDeviceSize VVar21;
  void *pvVar22;
  TextureLayerData *pTVar23;
  const_reference this_00;
  ConstPixelBufferAccess *pCVar24;
  const_reference this_01;
  TextureFormat *pTVar25;
  IVec3 *size;
  VkCommandBuffer_s **ppVVar26;
  VkBufferImageCopy *pVVar27;
  Handle<(vk::HandleType)6> *pHVar28;
  VkExtent3D VVar29;
  uint local_d80;
  uint local_d78;
  uint local_d70;
  undefined1 local_cc0 [8];
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  VkSubmitInfo submitInfo;
  VkPipelineStageFlags pipelineStageFlags;
  undefined1 local_c40 [8];
  VkBufferImageCopy layerRegion;
  PixelBufferAccess destAccess;
  ConstPixelBufferAccess *access_1;
  size_t layerNdx_1;
  TextureLayerData *layerData;
  size_t levelNdx;
  deUint8 *destPtr;
  undefined1 local_bb0 [4];
  deUint32 layerDataOffset;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined4 local_b70 [2];
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier preImageBarrier;
  VkBufferMemoryBarrier preBufferBarrier;
  VkMemoryRequirements local_a88;
  undefined1 local_a70 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  VkBufferCreateInfo bufferParams;
  Move<vk::VkCommandBuffer_s_*> local_a00;
  RefData<vk::VkCommandBuffer_s_*> local_9e0;
  Move<vk::Handle<(vk::HandleType)24>_> local_9c0;
  RefData<vk::Handle<(vk::HandleType)24>_> local_9a0;
  undefined1 local_980 [8];
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_938 [8];
  VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;
  VkSparseImageMemoryBindInfo imageResidencyBindInfo;
  VkBindSparseInfo bindSparseInfo;
  VkSparseMemoryBind imageMipTailMemoryBind;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_878;
  undefined1 local_868 [8];
  SharedPtr<vk::Allocation> allocation_1;
  VkMemoryRequirements allocRequirements_1;
  VkSparseImageMemoryBind imageMemoryBind;
  VkExtent3D extent;
  VkOffset3D offset;
  undefined1 local_7d0 [8];
  SharedPtr<vk::Allocation> allocation;
  VkMemoryRequirements allocRequirements;
  uint local_7a0;
  deUint32 x;
  deUint32 y;
  deUint32 z;
  UVec3 lastBlockExtent;
  UVec3 numSparseBinds;
  undefined1 local_770 [8];
  VkExtent3D mipExtent;
  uint local_75c;
  deUint32 mipLevelNdx;
  deUint32 layerNdx;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> imageMipTailMemoryBinds;
  vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
  imageResidencyMemoryBinds;
  uint uStack_720;
  VkExtent3D imageGranularity;
  VkSparseImageMemoryRequirements aspectRequirements;
  vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
  sparseImageFormatPropVec;
  deUint32 memoryTypeNdx;
  deUint32 memoryType;
  undefined1 local_6c0 [8];
  VkMemoryRequirements memoryRequirements;
  uint local_6a0;
  deUint32 memoryReqNdx;
  deUint32 colorAspectIndex;
  deUint32 noMatchFound;
  undefined1 local_690 [8];
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  sparseImageMemoryRequirements;
  uint local_66c;
  reference pCStack_668;
  deUint32 sparseMemoryReqCount;
  ConstPixelBufferAccess *access;
  __normal_iterator<const_tcu::ConstPixelBufferAccess_*,_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>
  local_658;
  const_iterator lit;
  __normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
  local_648;
  const_iterator mit;
  undefined1 local_638 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  deUint32 bufferSize;
  Move<vk::Handle<(vk::HandleType)4>_> local_610;
  RefData<vk::Handle<(vk::HandleType)4>_> local_5f0;
  undefined1 local_5d0 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> imageMemoryBindSemaphore;
  VkImageAspectFlags aspectMask;
  bool isShadowSampler;
  VkPhysicalDeviceMemoryProperties deviceMemoryProperties;
  VkPhysicalDeviceProperties deviceProperties;
  InstanceInterface *instance;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vk;
  VkDevice vkDevice;
  deUint32 arrayLayers_local;
  deUint32 mipLevels_local;
  Sampler *refSampler_local;
  TextureData *textureData_local;
  TextureFormat *texFormat_local;
  ShaderRenderCaseInstance *this_local;
  VkImage sparseImage_local;
  
  device = getDevice(this);
  vk_00 = getDeviceInterface(this);
  physicalDevice_00 = getPhysicalDevice(this);
  pVVar12 = getUniversalQueue(this);
  dVar5 = getUniversalQueueFamilyIndex(this);
  deviceProperties._816_8_ = getInstanceInterface(this);
  ::vk::getPhysicalDeviceProperties
            ((VkPhysicalDeviceProperties *)&deviceMemoryProperties.memoryHeaps[0xf].flags,
             (InstanceInterface *)deviceProperties._816_8_,physicalDevice_00);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&aspectMask,
             (InstanceInterface *)deviceProperties._816_8_,physicalDevice_00);
  imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator.
  _7_1_ = refSampler->compare != COMPAREMODE_NONE;
  imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator.
  _0_4_ = (byte)imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                deleter.m_allocator._7_1_ + 1;
  ::vk::createSemaphore(&local_610,vk_00,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5f0,(Move *)&local_610);
  data.deleter.m_deviceIface._0_4_ = (int)local_5f0.deleter.m_deviceIface;
  data.object.m_internal = local_5f0.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5f0.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_5f0.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_5f0.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_5f0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_5d0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move(&local_610);
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638);
  mit._M_current._4_4_ = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638,
             (value_type_conflict2 *)((long)&mit._M_current + 4));
  mit._M_current._0_4_ = tcu::TextureFormat::getPixelSize(texFormat);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638,
             (value_type_conflict2 *)&mit);
  bVar4 = isImageSizeSupported
                    (imageCreateInfo->imageType,texSize,
                     (VkPhysicalDeviceLimits *)(deviceProperties.pipelineCacheUUID + 0xc));
  if (!bVar4) {
    pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar13,"Image size not supported for device.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x59b);
    __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  local_648._M_current =
       (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
       std::
       vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
       ::begin(textureData);
  while( true ) {
    lit._M_current =
         (ConstPixelBufferAccess *)
         std::
         vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
         ::end(textureData);
    bVar4 = __gnu_cxx::operator!=
                      (&local_648,
                       (__normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
                        *)&lit);
    if (!bVar4) break;
    pvVar14 = __gnu_cxx::
              __normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
              ::operator->(&local_648);
    local_658._M_current =
         (ConstPixelBufferAccess *)
         std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
         begin(pvVar14);
    while( true ) {
      pvVar14 = __gnu_cxx::
                __normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
                ::operator->(&local_648);
      access = (ConstPixelBufferAccess *)
               std::
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
               end(pvVar14);
      bVar4 = __gnu_cxx::operator!=
                        (&local_658,
                         (__normal_iterator<const_tcu::ConstPixelBufferAccess_*,_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>
                          *)&access);
      if (!bVar4) break;
      pCStack_668 = __gnu_cxx::
                    __normal_iterator<const_tcu::ConstPixelBufferAccess_*,_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>
                    ::operator*(&local_658);
      offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           sr::anon_unknown_0::getNextMultiple
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638,
                      (deUint32)
                      offsetMultiples.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      iVar8 = tcu::ConstPixelBufferAccess::getWidth(pCStack_668);
      iVar9 = tcu::ConstPixelBufferAccess::getHeight(pCStack_668);
      iVar10 = tcu::ConstPixelBufferAccess::getDepth(pCStack_668);
      pTVar25 = tcu::ConstPixelBufferAccess::getFormat(pCStack_668);
      iVar11 = tcu::TextureFormat::getPixelSize(pTVar25);
      offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           iVar8 * iVar9 * iVar10 * iVar11 +
           (deUint32)
           offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      __gnu_cxx::
      __normal_iterator<const_tcu::ConstPixelBufferAccess_*,_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>
      ::operator++(&local_658);
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
    ::operator++(&local_648);
  }
  local_66c = 0;
  sparseImageMemoryRequirements.
  super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sparseImage.m_internal;
  (*vk_00->_vptr_DeviceInterface[0x10])(vk_00,device,sparseImage.m_internal,&local_66c,0);
  std::
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ::vector((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            *)local_690);
  std::
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ::resize((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            *)local_690,(ulong)local_66c);
  pvVar15 = std::
            vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            ::operator[]((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                          *)local_690,0);
  (*vk_00->_vptr_DeviceInterface[0x10])(vk_00,device,sparseImage.m_internal,&local_66c,pvVar15);
  local_6a0 = 0xffffffff;
  for (memoryRequirements._20_4_ = 0; (uint)memoryRequirements._20_4_ < local_66c;
      memoryRequirements._20_4_ = memoryRequirements._20_4_ + 1) {
    pvVar15 = std::
              vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
              ::operator[]((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                            *)local_690,(ulong)(uint)memoryRequirements._20_4_);
    if (((pvVar15->formatProperties).aspectMask & 1) != 0) {
      local_6a0 = memoryRequirements._20_4_;
      break;
    }
  }
  if (local_6a0 == 0xffffffff) {
    pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar13,
               "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x5c2);
    __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  ::vk::getImageMemoryRequirements((VkMemoryRequirements *)local_6c0,vk_00,device,sparseImage);
  sparseImageFormatPropVec.
  super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  sparseImageFormatPropVec.
  super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  do {
    if (aspectMask <=
        (uint)sparseImageFormatPropVec.
              super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00bc9815:
      if (sparseImageFormatPropVec.
          super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0xffffffff) {
        pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar13,"No matching memory type found.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                   ,0x5d2);
        __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      if ((ulong)local_6c0 <= deviceProperties.limits.bufferImageGranularity) {
        ::vk::getPhysicalDeviceSparseImageFormatProperties
                  ((vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                    *)&aspectRequirements.imageMipTailStride,
                   (InstanceInterface *)deviceProperties._816_8_,physicalDevice_00,
                   imageCreateInfo->format,imageCreateInfo->imageType,imageCreateInfo->samples,
                   imageCreateInfo->usage,imageCreateInfo->tiling);
        sVar16 = std::
                 vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                 ::size((vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                         *)&aspectRequirements.imageMipTailStride);
        if (sVar16 != 0) {
          pvVar15 = std::
                    vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                    ::operator[]((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                                  *)local_690,(ulong)local_6a0);
          memcpy(&imageGranularity.height,pvVar15,0x30);
          stack0xfffffffffffff8dc = stack0xfffffffffffff8ec;
          imageGranularity.width = aspectRequirements.formatProperties.imageGranularity.width;
          std::vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>::
          vector((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                  *)&imageMipTailMemoryBinds.
                     super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::vector
                    ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                     &mipLevelNdx);
          for (local_75c = 0; local_75c < arrayLayers; local_75c = local_75c + 1) {
            for (mipExtent.depth = 0;
                mipExtent.depth < aspectRequirements.formatProperties.imageGranularity.depth;
                mipExtent.depth = mipExtent.depth + 1) {
              VVar29 = mipLevelExtents(&imageCreateInfo->extent,mipExtent.depth);
              mipExtent.width = VVar29.depth;
              local_770 = VVar29._0_8_;
              alignedDivide((sr *)(lastBlockExtent.m_data + 1),(VkExtent3D *)local_770,
                            (VkExtent3D *)
                            ((long)&imageResidencyMemoryBinds.
                                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
              if ((uint)local_770._0_4_ %
                  imageResidencyMemoryBinds.
                  super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                local_d70 = imageResidencyMemoryBinds.
                            super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              }
              else {
                local_d70 = (uint)local_770._0_4_ %
                            imageResidencyMemoryBinds.
                            super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              }
              if ((uint)local_770._4_4_ % uStack_720 == 0) {
                local_d78 = uStack_720;
              }
              else {
                local_d78 = (uint)local_770._4_4_ % uStack_720;
              }
              if (mipExtent.width % imageGranularity.width == 0) {
                local_d80 = imageGranularity.width;
              }
              else {
                local_d80 = mipExtent.width % imageGranularity.width;
              }
              tcu::Vector<unsigned_int,_3>::Vector
                        ((Vector<unsigned_int,_3> *)&y,local_d70,local_d78,local_d80);
              for (x = 0; uVar6 = tcu::Vector<unsigned_int,_3>::z
                                            ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1)
                                            ), x < uVar6; x = x + 1) {
                for (local_7a0 = 0;
                    uVar6 = tcu::Vector<unsigned_int,_3>::y
                                      ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1)),
                    local_7a0 < uVar6; local_7a0 = local_7a0 + 1) {
                  for (allocRequirements._20_4_ = 0;
                      uVar6 = tcu::Vector<unsigned_int,_3>::x
                                        ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1)),
                      (uint)allocRequirements._20_4_ < uVar6;
                      allocRequirements._20_4_ = allocRequirements._20_4_ + 1) {
                    allocation.m_state = (SharedPtrStateBase *)memoryRequirements.size;
                    offset.y = ::vk::MemoryRequirement::Any;
                    (*this->m_memAlloc->_vptr_Allocator[3])
                              (&offset.z,this->m_memAlloc,&allocation.m_state,
                               (ulong)(uint)::vk::MemoryRequirement::Any);
                    pAVar17 = de::details::
                              MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                                        ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                          *)&offset.z);
                    de::SharedPtr<vk::Allocation>::SharedPtr
                              ((SharedPtr<vk::Allocation> *)local_7d0,pAVar17);
                    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                    ~MovePtr((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                             &offset.z);
                    std::
                    vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                    ::push_back(&this->m_allocations,(value_type *)local_7d0);
                    offset.x = x * imageGranularity.width;
                    uVar6 = tcu::Vector<unsigned_int,_3>::x
                                      ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
                    if (allocRequirements._20_4_ == uVar6 - 1) {
                      tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&y);
                    }
                    uVar6 = tcu::Vector<unsigned_int,_3>::y
                                      ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
                    if (local_7a0 == uVar6 - 1) {
                      tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&y);
                    }
                    uVar6 = tcu::Vector<unsigned_int,_3>::z
                                      ((Vector<unsigned_int,_3> *)(lastBlockExtent.m_data + 1));
                    if (x == uVar6 - 1) {
                      tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&y);
                    }
                    allocRequirements_1.memoryTypeBits =
                         (deUint32)
                         imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.
                         m_data.deleter.m_allocator;
                    allocRequirements_1._20_4_ = mipExtent.depth;
                    pAVar17 = de::SharedPtr<vk::Allocation>::operator->
                                        ((SharedPtr<vk::Allocation> *)local_7d0);
                    ::vk::Allocation::getMemory(pAVar17);
                    pAVar17 = de::SharedPtr<vk::Allocation>::operator->
                                        ((SharedPtr<vk::Allocation> *)local_7d0);
                    ::vk::Allocation::getOffset(pAVar17);
                    std::
                    vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                    ::push_back((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                 *)&imageMipTailMemoryBinds.
                                    super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (value_type *)&allocRequirements_1.memoryTypeBits);
                    de::SharedPtr<vk::Allocation>::~SharedPtr
                              ((SharedPtr<vk::Allocation> *)local_7d0);
                  }
                }
              }
            }
            sVar16 = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
                     size((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *
                          )&mipLevelNdx);
            if ((sVar16 == 0) ||
               ((sVar16 = std::
                          vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
                          size((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                                *)&mipLevelNdx), sVar16 != 0 &&
                ((aspectRequirements.formatProperties.imageGranularity.height & 1) == 0)))) {
              allocation_1.m_state = (SharedPtrStateBase *)aspectRequirements._16_8_;
              allocRequirements_1.size = memoryRequirements.size;
              allocRequirements_1.alignment._0_4_ = (uint)memoryRequirements.alignment;
              (*this->m_memAlloc->_vptr_Allocator[3])
                        (&local_878,this->m_memAlloc,&allocation_1.m_state,
                         (ulong)(uint)::vk::MemoryRequirement::Any);
              pAVar17 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                        release(&local_878);
              de::SharedPtr<vk::Allocation>::SharedPtr
                        ((SharedPtr<vk::Allocation> *)local_868,pAVar17);
              de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
                        (&local_878);
              bindSparseInfo.pSignalSemaphores =
                   (VkSemaphore *)
                   (aspectRequirements.imageMipTailSize +
                   local_75c * aspectRequirements.imageMipTailOffset);
              pAVar17 = de::SharedPtr<vk::Allocation>::operator->
                                  ((SharedPtr<vk::Allocation> *)local_868);
              ::vk::Allocation::getMemory(pAVar17);
              pAVar17 = de::SharedPtr<vk::Allocation>::operator->
                                  ((SharedPtr<vk::Allocation> *)local_868);
              ::vk::Allocation::getOffset(pAVar17);
              std::
              vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
              ::push_back(&this->m_allocations,(value_type *)local_868);
              std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
              push_back((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                        &mipLevelNdx,(value_type *)&bindSparseInfo.pSignalSemaphores);
              de::SharedPtr<vk::Allocation>::~SharedPtr((SharedPtr<vk::Allocation> *)local_868);
            }
          }
          bindSparseInfo.signalSemaphoreCount = 0;
          bindSparseInfo._84_4_ = 0;
          bindSparseInfo.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
          bindSparseInfo.imageBindCount = 0;
          bindSparseInfo._68_4_ = 0;
          bindSparseInfo.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
          bindSparseInfo.imageOpaqueBindCount = 0;
          bindSparseInfo._52_4_ = 0;
          bindSparseInfo.pWaitSemaphores = (VkSemaphore *)0x0;
          bindSparseInfo.bufferBindCount = 0;
          bindSparseInfo._36_4_ = 0;
          bindSparseInfo.pNext = (void *)0x0;
          bindSparseInfo.waitSemaphoreCount = 0;
          bindSparseInfo._20_4_ = 0;
          bindSparseInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          bindSparseInfo._4_4_ = 0;
          imageResidencyBindInfo.pBinds = (VkSparseImageMemoryBind *)0x7;
          bindSparseInfo.pImageBinds = (VkSparseImageMemoryBindInfo *)0x1;
          bindSparseInfo._80_8_ =
               ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                         ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_5d0);
          ::vk::VkSparseImageMemoryBindInfo::VkSparseImageMemoryBindInfo
                    ((VkSparseImageMemoryBindInfo *)&imageMipTailBindInfo.pBinds);
          ::vk::VkSparseImageOpaqueMemoryBindInfo::VkSparseImageOpaqueMemoryBindInfo
                    ((VkSparseImageOpaqueMemoryBindInfo *)local_938);
          sVar16 = std::
                   vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                   ::size((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                           *)&imageMipTailMemoryBinds.
                              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar16 != 0) {
            imageMipTailBindInfo.pBinds = (VkSparseMemoryBind *)sparseImage.m_internal;
            sVar16 = std::
                     vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                     ::size((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             *)&imageMipTailMemoryBinds.
                                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            imageResidencyBindInfo.image.m_internal._0_4_ = (undefined4)sVar16;
            imageResidencyBindInfo._8_8_ =
                 std::
                 vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>::
                 operator[]((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             *)&imageMipTailMemoryBinds.
                                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
            bindSparseInfo.pImageOpaqueBinds =
                 (VkSparseImageOpaqueMemoryBindInfo *)
                 CONCAT44(bindSparseInfo.pImageOpaqueBinds._4_4_,1);
            bindSparseInfo._64_8_ = &imageMipTailBindInfo.pBinds;
          }
          sVar16 = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
                   size((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                        &mipLevelNdx);
          if (sVar16 != 0) {
            local_938 = (undefined1  [8])sparseImage.m_internal;
            sVar16 = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
                     size((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *
                          )&mipLevelNdx);
            imageMipTailBindInfo.image.m_internal._0_4_ = (undefined4)sVar16;
            imageMipTailBindInfo._8_8_ =
                 std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
                 operator[]((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                             *)&mipLevelNdx,0);
            bindSparseInfo.pBufferBinds =
                 (VkSparseBufferMemoryBindInfo *)CONCAT44(bindSparseInfo.pBufferBinds._4_4_,1);
            bindSparseInfo._48_8_ = local_938;
          }
          ::vk::Handle<(vk::HandleType)6>::Handle
                    ((Handle<(vk::HandleType)6> *)
                     &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator,0);
          VVar7 = (*vk_00->_vptr_DeviceInterface[0x11])
                            (vk_00,pVVar12,1,&imageResidencyBindInfo.pBinds,
                             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                             m_allocator);
          ::vk::checkResult(VVar7,"vk.queueBindSparse(queue, 1u, &bindSparseInfo, DE_NULL)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                            ,0x661);
          std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::~vector
                    ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                     &mipLevelNdx);
          std::vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>::
          ~vector((vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                   *)&imageMipTailMemoryBinds.
                      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
          ::~vector((vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                     *)&aspectRequirements.imageMipTailStride);
          std::
          vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ::~vector((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                     *)local_690);
          ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move
                    ((Move<vk::Handle<(vk::HandleType)24>_> *)
                     &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
          ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move
                    ((Move<vk::VkCommandBuffer_s_*> *)local_980);
          ::vk::createCommandPool(&local_9c0,vk_00,device,1,dVar5,(VkAllocationCallbacks *)0x0);
          ::vk::refdetails::Move::operator_cast_to_RefData(&local_9a0,(Move *)&local_9c0);
          data_00.deleter.m_deviceIface._0_4_ = (int)local_9a0.deleter.m_deviceIface;
          data_00.object.m_internal = local_9a0.object.m_internal;
          data_00.deleter.m_deviceIface._4_4_ =
               (int)((ulong)local_9a0.deleter.m_deviceIface >> 0x20);
          data_00.deleter.m_device = local_9a0.deleter.m_device;
          data_00.deleter.m_allocator._0_4_ = (int)local_9a0.deleter.m_allocator;
          data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_9a0.deleter.m_allocator >> 0x20);
          ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=
                    ((Move<vk::Handle<(vk::HandleType)24>_> *)
                     &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,data_00
                    );
          ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_9c0);
          pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                                m_pool);
          ::vk::allocateCommandBuffer
                    (&local_a00,vk_00,device,(VkCommandPool)pHVar18->m_internal,
                     VK_COMMAND_BUFFER_LEVEL_PRIMARY);
          ::vk::refdetails::Move::operator_cast_to_RefData(&local_9e0,(Move *)&local_a00);
          data_01.deleter.m_deviceIface._0_4_ = (int)local_9e0.deleter.m_deviceIface;
          data_01.object = local_9e0.object;
          data_01.deleter.m_deviceIface._4_4_ =
               (int)((ulong)local_9e0.deleter.m_deviceIface >> 0x20);
          data_01.deleter.m_device = local_9e0.deleter.m_device;
          data_01.deleter.m_pool.m_internal._0_4_ = (int)local_9e0.deleter.m_pool.m_internal;
          data_01.deleter.m_pool.m_internal._4_4_ =
               (int)(local_9e0.deleter.m_pool.m_internal >> 0x20);
          ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=
                    ((Move<vk::VkCommandBuffer_s_*> *)local_980,data_01);
          ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_a00);
          buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ =
               0xc;
          ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                             &bufferAlloc.
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.field_0x8,vk_00,device,
                             (VkBufferCreateInfo *)
                             &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                              m_allocator,(VkAllocationCallbacks *)0x0);
          pAVar1 = this->m_memAlloc;
          pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                               &bufferAlloc.
                                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                .m_data.field_0x8);
          ::vk::getBufferMemoryRequirements(&local_a88,vk_00,device,(VkBuffer)pHVar19->m_internal);
          (*pAVar1->_vptr_Allocator[3])
                    (local_a70,pAVar1,&local_a88,(ulong)::vk::MemoryRequirement::HostVisible);
          pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                               &bufferAlloc.
                                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                .m_data.field_0x8);
          dVar2 = pHVar19->m_internal;
          pAVar17 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                    operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                               local_a70);
          VVar20 = ::vk::Allocation::getMemory(pAVar17);
          pAVar17 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                    operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                               local_a70);
          VVar21 = ::vk::Allocation::getOffset(pAVar17);
          VVar7 = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,dVar2,VVar20.m_internal,VVar21);
          ::vk::checkResult(VVar7,
                            "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                            ,0x67c);
          preImageBarrier.subresourceRange.layerCount = 0x2c;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                    ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                     &bufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
          postImageBarrier.subresourceRange.layerCount = 0x2d;
          preImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          preImageBarrier._4_4_ = 0;
          preImageBarrier.pNext._0_4_ = 0;
          preImageBarrier.pNext._4_4_ = 0x1000;
          preImageBarrier.srcAccessMask = 0;
          preImageBarrier.dstAccessMask = 7;
          preImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
          preImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
          preImageBarrier._32_8_ = sparseImage.m_internal;
          preImageBarrier.image.m_internal._0_4_ =
               (deUint32)
               imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter
               .m_allocator;
          preImageBarrier.image.m_internal._4_4_ = 0;
          preImageBarrier.subresourceRange.baseMipLevel = 0;
          local_b70[0] = 0x2d;
          postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          postImageBarrier._4_4_ = 0;
          postImageBarrier.pNext._0_4_ = 0x1000;
          postImageBarrier.pNext._4_4_ = 0x20;
          postImageBarrier.srcAccessMask = 7;
          postImageBarrier.dstAccessMask = 5;
          postImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
          postImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
          postImageBarrier._32_8_ = sparseImage.m_internal;
          postImageBarrier.image.m_internal._0_4_ =
               (deUint32)
               imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter
               .m_allocator;
          postImageBarrier.image.m_internal._4_4_ = 0;
          postImageBarrier.subresourceRange.baseMipLevel = 0;
          copyRegions.
          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x2a;
          postImageBarrier.subresourceRange.aspectMask = mipLevels;
          postImageBarrier.subresourceRange.levelCount = arrayLayers;
          preImageBarrier.subresourceRange.aspectMask = mipLevels;
          preImageBarrier.subresourceRange.levelCount = arrayLayers;
          std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::vector
                    ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                     local_bb0);
          destPtr._4_4_ = 0;
          pAVar17 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                    operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                               local_a70);
          pvVar22 = ::vk::Allocation::getHostPtr(pAVar17);
          for (layerData = (TextureLayerData *)0x0;
              pTVar23 = (TextureLayerData *)
                        std::
                        vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                        ::size(textureData), layerData < pTVar23;
              layerData = (TextureLayerData *)
                          ((long)&(layerData->
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1)) {
            this_00 = std::
                      vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                      ::operator[](textureData,(size_type)layerData);
            for (access_1 = (ConstPixelBufferAccess *)0x0;
                pCVar24 = (ConstPixelBufferAccess *)
                          std::
                          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ::size(this_00), access_1 < pCVar24;
                access_1 = (ConstPixelBufferAccess *)((long)&(access_1->m_format).order + 1)) {
              dVar5 = sr::anon_unknown_0::getNextMultiple
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638,
                                 destPtr._4_4_);
              this_01 = std::
                        vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        ::operator[](this_00,(size_type)access_1);
              pTVar25 = tcu::ConstPixelBufferAccess::getFormat(this_01);
              size = tcu::ConstPixelBufferAccess::getSize(this_01);
              tcu::PixelBufferAccess::PixelBufferAccess
                        ((PixelBufferAccess *)&layerRegion.imageExtent.height,pTVar25,size,
                         (void *)((long)pvVar22 + (ulong)dVar5));
              local_c40 = (undefined1  [8])(ulong)dVar5;
              layerRegion.bufferOffset._0_4_ = tcu::ConstPixelBufferAccess::getWidth(this_01);
              layerRegion.bufferOffset._4_4_ = tcu::ConstPixelBufferAccess::getHeight(this_01);
              layerRegion.bufferRowLength =
                   (deUint32)
                   imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                   deleter.m_allocator;
              layerRegion.bufferImageHeight = (deUint32)layerData;
              layerRegion.imageSubresource.aspectMask = (VkImageAspectFlags)access_1;
              layerRegion.imageSubresource.mipLevel = 1;
              layerRegion.imageSubresource.baseArrayLayer = 0;
              layerRegion.imageSubresource.layerCount = 0;
              layerRegion.imageOffset.x = 0;
              layerRegion.imageOffset.y = tcu::ConstPixelBufferAccess::getWidth(this_01);
              layerRegion.imageOffset.z = tcu::ConstPixelBufferAccess::getHeight(this_01);
              layerRegion.imageExtent.width = tcu::ConstPixelBufferAccess::getDepth(this_01);
              std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::push_back
                        ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                         local_bb0,(value_type *)local_c40);
              tcu::copy((EVP_PKEY_CTX *)&layerRegion.imageExtent.height,(EVP_PKEY_CTX *)this_01);
              iVar8 = tcu::ConstPixelBufferAccess::getWidth(this_01);
              iVar9 = tcu::ConstPixelBufferAccess::getHeight(this_01);
              iVar10 = tcu::ConstPixelBufferAccess::getDepth(this_01);
              pTVar25 = tcu::ConstPixelBufferAccess::getFormat(this_01);
              iVar11 = tcu::TextureFormat::getPixelSize(pTVar25);
              destPtr._4_4_ = iVar8 * iVar9 * iVar10 * iVar11 + dVar5;
            }
          }
          ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                               ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
          VVar7 = (*vk_00->_vptr_DeviceInterface[0x49])
                            (vk_00,*ppVVar26,
                             &copyRegions.
                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::vk::checkResult(VVar7,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                            ,0x6e9);
          ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                               ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
          (*vk_00->_vptr_DeviceInterface[0x6d])
                    (vk_00,*ppVVar26,0x4000,0x1000,0,0,0,1,
                     &preImageBarrier.subresourceRange.layerCount,1,
                     &postImageBarrier.subresourceRange.layerCount);
          ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                               ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
          pVVar3 = *ppVVar26;
          pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                               &bufferAlloc.
                                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                .m_data.field_0x8);
          dVar2 = pHVar19->m_internal;
          sVar16 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::size
                             ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                               *)local_bb0);
          pVVar27 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::data
                              ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                *)local_bb0);
          (*vk_00->_vptr_DeviceInterface[0x62])
                    (vk_00,pVVar3,dVar2,sparseImage.m_internal,7,sVar16 & 0xffffffff,(int)pVVar27);
          ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                               ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
          (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar26,0x1000,1,0,0,0,0,0,1,local_b70);
          ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                               ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
          VVar7 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar26);
          ::vk::checkResult(VVar7,"vk.endCommandBuffer(*cmdBuffer)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                            ,0x6ed);
          submitInfo.pSignalSemaphores._4_4_ = 0x8000;
          fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._0_4_ = 4;
          submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          submitInfo._4_4_ = 0;
          submitInfo.pNext._0_4_ = 1;
          submitInfo._16_8_ =
               ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                         ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_5d0);
          submitInfo.pWaitSemaphores = (VkSemaphore *)((long)&submitInfo.pSignalSemaphores + 4);
          submitInfo.pWaitDstStageMask._0_4_ = 1;
          submitInfo._40_8_ =
               ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_980);
          submitInfo.pCommandBuffers._0_4_ = 0;
          submitInfo.signalSemaphoreCount = 0;
          submitInfo._60_4_ = 0;
          ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_cc0,vk_00,device,0,
                            (VkAllocationCallbacks *)0x0);
          pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_cc0);
          VVar7 = (*vk_00->_vptr_DeviceInterface[2])
                            (vk_00,pVVar12,1,
                             &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                              m_allocator,pHVar28->m_internal);
          ::vk::checkResult(VVar7,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                            ,0x702);
          pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_cc0);
          VVar7 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar28,1,0xffffffffffffffff)
          ;
          ::vk::checkResult(VVar7,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                            ,0x703);
          ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
                    ((Move<vk::Handle<(vk::HandleType)6>_> *)local_cc0);
          std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~vector
                    ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                     local_bb0);
          de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
                    ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a70);
          ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
                    ((Move<vk::Handle<(vk::HandleType)8>_> *)
                     &bufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
          ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
                    ((Move<vk::VkCommandBuffer_s_*> *)local_980);
          ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
                    ((Move<vk::Handle<(vk::HandleType)24>_> *)
                     &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638);
          ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
                    ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_5d0);
          return;
        }
        pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar13,"The image format does not support sparse operations.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                   ,0x5dc);
        __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar13,"Required memory size for sparse resource exceeds device limits.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                 ,0x5d5);
      __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    if ((((uint)memoryRequirements.alignment &
         1 << ((byte)(uint)sparseImageFormatPropVec.
                           super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1f)) != 0) &&
       (bVar4 = ::vk::MemoryRequirement::matchesHeap
                          ((MemoryRequirement *)&::vk::MemoryRequirement::Any,
                           *(VkMemoryPropertyFlags *)
                            (&stack0xfffffffffffffa5c +
                            (ulong)(uint)sparseImageFormatPropVec.
                                         super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage * 8)),
       bVar4)) {
      sparseImageFormatPropVec.
      super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (uint)sparseImageFormatPropVec.
                 super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      goto LAB_00bc9815;
    }
    sparseImageFormatPropVec.
    super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)sparseImageFormatPropVec.
               super__Vector_base<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  } while( true );
}

Assistant:

void ShaderRenderCaseInstance::uploadSparseImage (const tcu::TextureFormat&		texFormat,
												  const TextureData&			textureData,
												  const tcu::Sampler&			refSampler,
												  const deUint32				mipLevels,
												  const deUint32				arrayLayers,
												  const VkImage					sparseImage,
												  const VkImageCreateInfo&		imageCreateInfo,
												  const tcu::UVec3				texSize)
{
	const VkDevice							vkDevice				= getDevice();
	const DeviceInterface&					vk						= getDeviceInterface();
	const VkPhysicalDevice					physicalDevice			= getPhysicalDevice();
	const VkQueue							queue					= getUniversalQueue();
	const deUint32							queueFamilyIndex		= getUniversalQueueFamilyIndex();
	const InstanceInterface&				instance				= getInstanceInterface();
	const VkPhysicalDeviceProperties		deviceProperties		= getPhysicalDeviceProperties(instance, physicalDevice);
	const VkPhysicalDeviceMemoryProperties	deviceMemoryProperties	= getPhysicalDeviceMemoryProperties(instance, physicalDevice);
	const bool								isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags				aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;

	const Unique<VkSemaphore>				imageMemoryBindSemaphore(createSemaphore(vk, vkDevice));
	deUint32								bufferSize				= 0u;
	std::vector<deUint32>					offsetMultiples;
	offsetMultiples.push_back(4u);
	offsetMultiples.push_back(texFormat.getPixelSize());

	if (isImageSizeSupported(imageCreateInfo.imageType, texSize, deviceProperties.limits) == false)
		TCU_THROW(NotSupportedError, "Image size not supported for device.");

	// Calculate buffer size
	for (TextureData::const_iterator mit = textureData.begin(); mit != textureData.end(); ++mit)
	{
		for (TextureLayerData::const_iterator lit = mit->begin(); lit != mit->end(); ++lit)
		{
			const tcu::ConstPixelBufferAccess&	access	= *lit;

			bufferSize = getNextMultiple(offsetMultiples, bufferSize);
			bufferSize += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
		}
	}

	{
		deUint32 sparseMemoryReqCount = 0;

		vk.getImageSparseMemoryRequirements(vkDevice, sparseImage, &sparseMemoryReqCount, DE_NULL);

		DE_ASSERT(sparseMemoryReqCount != 0);

		std::vector<VkSparseImageMemoryRequirements> sparseImageMemoryRequirements;
		sparseImageMemoryRequirements.resize(sparseMemoryReqCount);

		vk.getImageSparseMemoryRequirements(vkDevice, sparseImage, &sparseMemoryReqCount, &sparseImageMemoryRequirements[0]);

		const deUint32 noMatchFound = ~((deUint32)0);

		deUint32 colorAspectIndex = noMatchFound;
		for (deUint32 memoryReqNdx = 0; memoryReqNdx < sparseMemoryReqCount; ++memoryReqNdx)
		{
			if (sparseImageMemoryRequirements[memoryReqNdx].formatProperties.aspectMask & VK_IMAGE_ASPECT_COLOR_BIT)
			{
				colorAspectIndex = memoryReqNdx;
				break;
			}
		}

		if (colorAspectIndex == noMatchFound)
			TCU_THROW(NotSupportedError, "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT.");

		const VkMemoryRequirements	memoryRequirements	= getImageMemoryRequirements(vk, vkDevice, sparseImage);

		deUint32 memoryType = noMatchFound;
		for (deUint32 memoryTypeNdx = 0; memoryTypeNdx < deviceMemoryProperties.memoryTypeCount; ++memoryTypeNdx)
		{
			if ((memoryRequirements.memoryTypeBits & (1u << memoryTypeNdx)) != 0 &&
				MemoryRequirement::Any.matchesHeap(deviceMemoryProperties.memoryTypes[memoryTypeNdx].propertyFlags))
			{
				memoryType = memoryTypeNdx;
				break;
			}
		}

		if (memoryType == noMatchFound)
			TCU_THROW(NotSupportedError, "No matching memory type found.");

		if (memoryRequirements.size > deviceProperties.limits.sparseAddressSpaceSize)
			TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits.");

		// Check if the image format supports sparse oprerations
		const std::vector<VkSparseImageFormatProperties> sparseImageFormatPropVec =
			getPhysicalDeviceSparseImageFormatProperties(instance, physicalDevice, imageCreateInfo.format, imageCreateInfo.imageType, imageCreateInfo.samples, imageCreateInfo.usage, imageCreateInfo.tiling);

		if (sparseImageFormatPropVec.size() == 0)
			TCU_THROW(NotSupportedError, "The image format does not support sparse operations.");

		const VkSparseImageMemoryRequirements		aspectRequirements	= sparseImageMemoryRequirements[colorAspectIndex];
		const VkExtent3D							imageGranularity	= aspectRequirements.formatProperties.imageGranularity;

		std::vector<VkSparseImageMemoryBind>		imageResidencyMemoryBinds;
		std::vector<VkSparseMemoryBind>				imageMipTailMemoryBinds;

		for (deUint32 layerNdx = 0; layerNdx < arrayLayers; ++ layerNdx)
		{
			for (deUint32 mipLevelNdx = 0; mipLevelNdx < aspectRequirements.imageMipTailFirstLod; ++mipLevelNdx)
			{
				const VkExtent3D	mipExtent		= mipLevelExtents(imageCreateInfo.extent, mipLevelNdx);
				const tcu::UVec3	numSparseBinds	= alignedDivide(mipExtent, imageGranularity);
				const tcu::UVec3	lastBlockExtent	= tcu::UVec3(mipExtent.width  % imageGranularity.width  ? mipExtent.width  % imageGranularity.width  : imageGranularity.width,
																 mipExtent.height % imageGranularity.height ? mipExtent.height % imageGranularity.height : imageGranularity.height,
																 mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth  % imageGranularity.depth  : imageGranularity.depth );

				for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
				for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
				for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
				{
					const VkMemoryRequirements allocRequirements =
					{
						// 28.7.5 alignment shows the block size in bytes
						memoryRequirements.alignment,		// VkDeviceSize	size;
						memoryRequirements.alignment,		// VkDeviceSize	alignment;
						memoryRequirements.memoryTypeBits,	// uint32_t		memoryTypeBits;
					};

					de::SharedPtr<Allocation> allocation(m_memAlloc.allocate(allocRequirements, MemoryRequirement::Any).release());

					m_allocations.push_back(allocation);

					VkOffset3D offset;
					offset.x = x*imageGranularity.width;
					offset.y = y*imageGranularity.height;
					offset.z = z*imageGranularity.depth;

					VkExtent3D extent;
					extent.width	= (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
					extent.height	= (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
					extent.depth	= (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

					const VkSparseImageMemoryBind imageMemoryBind =
					{
						{
							aspectMask,	// VkImageAspectFlags	aspectMask;
							mipLevelNdx,// uint32_t				mipLevel;
							layerNdx,	// uint32_t				arrayLayer;
						},							// VkImageSubresource		subresource;
						offset,						// VkOffset3D				offset;
						extent,						// VkExtent3D				extent;
						allocation->getMemory(),	// VkDeviceMemory			memory;
						allocation->getOffset(),	// VkDeviceSize				memoryOffset;
						0u,							// VkSparseMemoryBindFlags	flags;
					};

					imageResidencyMemoryBinds.push_back(imageMemoryBind);
				}
			}

			// Handle MIP tail. There are two cases to consider here:
			//
			// 1) VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT is requested by the driver: each layer needs a separate tail.
			// 2) otherwise:                                                            only one tail is needed.
			{
				if ( imageMipTailMemoryBinds.size() == 0                                                                                                   ||
					(imageMipTailMemoryBinds.size() != 0 && (aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) == 0))
				{
					const VkMemoryRequirements allocRequirements =
					{
						aspectRequirements.imageMipTailSize,	// VkDeviceSize	size;
						memoryRequirements.alignment,			// VkDeviceSize	alignment;
						memoryRequirements.memoryTypeBits,		// uint32_t		memoryTypeBits;
					};

					const de::SharedPtr<Allocation> allocation(m_memAlloc.allocate(allocRequirements, MemoryRequirement::Any).release());

					const VkSparseMemoryBind imageMipTailMemoryBind =
					{
						aspectRequirements.imageMipTailOffset + layerNdx * aspectRequirements.imageMipTailStride,	// VkDeviceSize					resourceOffset;
						aspectRequirements.imageMipTailSize,														// VkDeviceSize					size;
						allocation->getMemory(),																	// VkDeviceMemory				memory;
						allocation->getOffset(),																	// VkDeviceSize					memoryOffset;
						0u,																							// VkSparseMemoryBindFlags		flags;
					};

					m_allocations.push_back(allocation);
					imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
				}
			}
		}

		VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		VkSparseImageMemoryBindInfo			imageResidencyBindInfo;
		VkSparseImageOpaqueMemoryBindInfo	imageMipTailBindInfo;

		if (imageResidencyMemoryBinds.size() > 0)
		{
			imageResidencyBindInfo.image		= sparseImage;
			imageResidencyBindInfo.bindCount	= static_cast<deUint32>(imageResidencyMemoryBinds.size());
			imageResidencyBindInfo.pBinds		= &imageResidencyMemoryBinds[0];

			bindSparseInfo.imageBindCount		= 1u;
			bindSparseInfo.pImageBinds			= &imageResidencyBindInfo;
		}

		if (imageMipTailMemoryBinds.size() > 0)
		{
			imageMipTailBindInfo.image = sparseImage;
			imageMipTailBindInfo.bindCount = static_cast<deUint32>(imageMipTailMemoryBinds.size());
			imageMipTailBindInfo.pBinds = &imageMipTailMemoryBinds[0];

			bindSparseInfo.imageOpaqueBindCount = 1u;
			bindSparseInfo.pImageOpaqueBinds = &imageMipTailBindInfo;
		}

		VK_CHECK(vk.queueBindSparse(queue, 1u, &bindSparseInfo, DE_NULL));
	}

	Move<VkCommandPool>		cmdPool;
	Move<VkCommandBuffer>	cmdBuffer;

	// Create command pool
	cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);

	// Create command buffer
	cmdBuffer = allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create source buffer
	const VkBufferCreateInfo bufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		bufferSize,									// VkDeviceSize			size;
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		0u,											// deUint32				queueFamilyIndexCount;
		DE_NULL,									// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>					buffer		= createBuffer(vk, vkDevice, &bufferParams);
	de::MovePtr<Allocation>			bufferAlloc = m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier preBufferBarrier =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		bufferSize									// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		sparseImage,									// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		sparseImage,									// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	std::vector<VkBufferImageCopy>	copyRegions;
	// Get copy regions and write buffer data
	{
		deUint32	layerDataOffset		= 0;
		deUint8*	destPtr				= (deUint8*)bufferAlloc->getHostPtr();

		for (size_t levelNdx = 0; levelNdx < textureData.size(); levelNdx++)
		{
			const TextureLayerData&		layerData	= textureData[levelNdx];

			for (size_t layerNdx = 0; layerNdx < layerData.size(); layerNdx++)
			{
				layerDataOffset = getNextMultiple(offsetMultiples, layerDataOffset);

				const tcu::ConstPixelBufferAccess&	access		= layerData[layerNdx];
				const tcu::PixelBufferAccess		destAccess	(access.getFormat(), access.getSize(), destPtr + layerDataOffset);

				const VkBufferImageCopy				layerRegion =
				{
					layerDataOffset,						// VkDeviceSize				bufferOffset;
					(deUint32)access.getWidth(),			// deUint32					bufferRowLength;
					(deUint32)access.getHeight(),			// deUint32					bufferImageHeight;
					{										// VkImageSubresourceLayers	imageSubresource;
						aspectMask,								// VkImageAspectFlags		aspectMask;
						(deUint32)levelNdx,						// uint32_t					mipLevel;
						(deUint32)layerNdx,						// uint32_t					baseArrayLayer;
						1u										// uint32_t					layerCount;
					},
					{ 0u, 0u, 0u },							// VkOffset3D			imageOffset;
					{										// VkExtent3D			imageExtent;
						(deUint32)access.getWidth(),
						(deUint32)access.getHeight(),
						(deUint32)access.getDepth()
					}
				};

				copyRegions.push_back(layerRegion);
				tcu::copy(destAccess, access);

				layerDataOffset += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
			}
		}
	}

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &preBufferBarrier, 1, &preImageBarrier);
	vk.cmdCopyBufferToImage(*cmdBuffer, *buffer, sparseImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copyRegions.size(), copyRegions.data());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkPipelineStageFlags pipelineStageFlags = VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT;

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType				sType;
		DE_NULL,								// const void*					pNext;
		1u,										// deUint32						waitSemaphoreCount;
		&imageMemoryBindSemaphore.get(),		// const VkSemaphore*			pWaitSemaphores;
		&pipelineStageFlags,					// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,										// deUint32						commandBufferCount;
		&cmdBuffer.get(),						// const VkCommandBuffer*		pCommandBuffers;
		0u,										// deUint32						signalSemaphoreCount;
		DE_NULL									// const VkSemaphore*			pSignalSemaphores;
	};

	Move<VkFence>	fence = createFence(vk, vkDevice);

	try
	{
		VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
	}
	catch (...)
	{
		VK_CHECK(vk.deviceWaitIdle(vkDevice));
		throw;
	}
}